

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::binary_op_max>(Mat *a,float b,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  binary_op_max *pbVar4;
  long in_RDI;
  float fVar5;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  binary_op_max op;
  float *in_stack_ffffffffffffff68;
  binary_op_max *this;
  int local_84;
  int in_stack_ffffffffffffff94;
  Mat *in_stack_ffffffffffffff98;
  int local_30;
  
  iVar1 = *(int *)(in_RDI + 0x2c);
  iVar2 = *(int *)(in_RDI + 0x30);
  iVar3 = *(int *)(in_RDI + 0x38);
  for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
    Mat::channel(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    pbVar4 = (binary_op_max *)Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff80);
    Mat::~Mat((Mat *)0x55838f);
    this = pbVar4;
    for (local_84 = 0; local_84 < iVar1 * iVar2; local_84 = local_84 + 1) {
      fVar5 = binary_op_max::operator()(this,in_stack_ffffffffffffff68,(float *)0x5583ce);
      *(float *)(pbVar4 + (long)local_84 * 4) = fVar5;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}